

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

uint8_t item_visible(tgestate_t *state,uint8_t *left_skip,uint8_t *clipped_width,uint8_t *top_skip,
                    uint8_t *clipped_height)

{
  uint8_t uVar1;
  uint8_t uVar2;
  char cVar3;
  uint8_t uVar4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  bool bVar8;
  
  *left_skip = 0xff;
  *clipped_width = 0xff;
  *top_skip = 0xff;
  *clipped_height = 0xff;
  uVar7 = (state->isopos).x;
  uVar2 = (state->map_position).x;
  bVar5 = ((char)state->columns + uVar2) - uVar7;
  uVar4 = '\x01';
  if ('\0' < (char)bVar5) {
    uVar1 = (state->map_position).y;
    if (bVar5 < 3) {
      uVar7 = '\0';
    }
    else {
      bVar6 = (uVar7 - uVar2) + 3;
      if ((char)bVar6 < '\x01') {
        return '\x01';
      }
      bVar5 = 3;
      if (bVar6 < 3) {
        bVar5 = bVar6;
      }
      uVar7 = '\x03' - bVar6;
      if (3 < bVar6) {
        uVar7 = '\0';
      }
    }
    uVar2 = (state->isopos).y;
    cVar3 = ((char)state->rows + uVar1) - uVar2;
    if ('\0' < cVar3) {
      if (cVar3 == '\x01') {
        uVar2 = '\b';
        uVar4 = '\0';
      }
      else {
        uVar2 = uVar2 + '\x02';
        if (uVar2 == uVar1) {
          return '\x01';
        }
        bVar8 = (byte)(uVar2 - uVar1) < 2;
        uVar2 = state->item_height + 0xf8;
        if (!bVar8) {
          uVar2 = state->item_height;
        }
        uVar4 = bVar8 << 3;
      }
      *left_skip = uVar7;
      *clipped_width = bVar5;
      *top_skip = uVar4;
      *clipped_height = uVar2;
      uVar4 = '\0';
    }
  }
  return uVar4;
}

Assistant:

uint8_t item_visible(tgestate_t *state,
                     uint8_t    *left_skip,
                     uint8_t    *clipped_width,
                     uint8_t    *top_skip,
                     uint8_t    *clipped_height)
{
#define WIDTH_BYTES 3 /* in bytes - items are always 16 pixels wide */
#define HEIGHT      2 /* in UDGs - items are ~ 16 pixels high */

  const pos8_t *pisopos;            /* was HL */
  pos8_t        map_position;       /* was DE */
  uint8_t       window_right_edge;  /* was A  */
  int8_t        available_right;    /* was A  */
  uint8_t       new_left;           /* was B  */
  uint8_t       new_width;          /* was C  */
  uint8_t       item_right_edge;    /* was A  */
  int8_t        available_left;     /* was A  */
  uint8_t       window_bottom_edge; /* was A  */
  int8_t        available_bottom;   /* was A  */
  uint8_t       new_top;            /* was D  */
  uint8_t       new_height;         /* was E  */
  uint8_t       item_bottom_edge;   /* was A  */
  uint8_t       available_top;      /* was A  */

  assert(state          != NULL);
  assert(clipped_width  != NULL);
  assert(clipped_height != NULL);

  /* Conv: Added to guarantee initialisation of return values. */
  *left_skip      = 255;
  *clipped_width  = 255;
  *top_skip       = 255;
  *clipped_height = 255;

  /* To determine visibility and sort out clipping there are five cases to
   * consider per axis:
   * (A) item is completely off left/top of screen
   * (B) item is clipped/truncated on its left/top
   * (C) item is entirely visible
   * (D) item is clipped/truncated on its right/bottom
   * (E) item is completely off right/bottom of screen
   */

  /*
   * Handle horizontal intersections.
   */

  pisopos = &state->isopos;
  map_position = state->map_position;

  /* Conv: Columns was constant 24; replaced with state var. */
  window_right_edge = map_position.x + state->columns;

  /* Subtracting item's x gives the space available between item's left edge
   * and the right edge of the window (in bytes).
   * Note that available_right is signed to enable the subsequent test. */
  available_right = window_right_edge - pisopos->x;
  if (available_right <= 0)
    /* Case (E): Item is beyond the window's right edge. */
    goto invisible;

  /* Check for item partway off-screen. */
  if (available_right < WIDTH_BYTES)
  {
    /* Case (D): Item's right edge is off-screen, so truncate width. */
    new_left  = 0;
    new_width = available_right;
  }
  else
  {
    /* Calculate the right edge of the item. */
    item_right_edge = pisopos->x + WIDTH_BYTES;

    /* Subtracting the map position's x gives the space available between
     * item's right edge and the left edge of the window (in bytes).
     * Note that available_left is signed to allow the subsequent test. */
    available_left = item_right_edge - map_position.x;
    if (available_left <= 0)
      /* Case (A): Item's right edge is beyond the window's left edge. */
      goto invisible;

    /* Check for item partway off-screen. */
    if (available_left < WIDTH_BYTES)
    {
      /* Case (B): Left edge is off-screen and right edge is on-screen.
       * Pack the lefthand skip into the low byte and the clipped width into
       * the high byte. */
      new_left  = WIDTH_BYTES - available_left;
      new_width = available_left;
    }
    else
    {
      /* Case (C): No clipping. */
      new_left  = 0;
      new_width = WIDTH_BYTES;
    }
  }

  /*
   * Handle vertical intersections.
   */

  /* Note: The companion code in vischar_visible uses 16-bit quantities
   * in its equivalent of the following. */

  /* Calculate the bottom edge of the window in map space. */
  /* Conv: Rows was constant 17; replaced with state var. */
  window_bottom_edge = map_position.y + state->rows;

  /* Subtracting the item's y gives the space available between window's
   * bottom edge and the item's top. */
  available_bottom = window_bottom_edge - pisopos->y;
  if (available_bottom <= 0)
    /* Case (E): Item is beyond the window's bottom edge. */
    goto invisible;

  /* Check for item partway off-screen. */
  if (available_bottom < HEIGHT)
  {
    /* Case (D): Item's bottom edge is off-screen, so truncate height. */
    new_top    = 0;
    new_height = 8;
  }
  else
  {
    /* Calculate the bottom edge of the item. */
    item_bottom_edge = pisopos->y + HEIGHT;

    /* Subtracting the map position's y (scaled) gives the space available
     * between item's bottom edge and the top edge of the window (in UDGs).
     */
    available_top = item_bottom_edge - map_position.y;
    if (available_top <= 0)
      goto invisible;

    /* Check for item partway off-screen. */
    if (available_top < HEIGHT)
    {
      /* Case (B): Top edge is off-screen and bottom edge is on-screen.
       * Pack the top skip into the low byte and the clipped height into the
       * high byte. */
      new_top    = 8;
      new_height = state->item_height - 8;
    }
    else
    {
      /* Case (C): No clipping. */
      new_top    = 0;
      new_height = state->item_height;
    }
  }

  *left_skip      = new_left;
  *clipped_width  = new_width;
  *top_skip       = new_top;
  *clipped_height = new_height;

  return 0; /* Visible */


invisible:
  return 1;
}